

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O0

void __thiscall
OpenMD::NPA::getPosScale(NPA *this,Vector3d *pos,Vector3d *COM,int index,Vector3d *sc)

{
  int in_ECX;
  Vector<double,_3U> *in_RDI;
  Vector3d rj;
  Vector<double,_3U> *in_stack_ffffffffffffff60;
  Vector<double,_3U> *in_stack_ffffffffffffff68;
  Vector<double,_3U> *in_stack_ffffffffffffff80;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffff88;
  
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             (in_RDI + 0xe),(long)in_ECX);
  OpenMD::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  operator/(in_stack_ffffffffffffff68,(double)in_stack_ffffffffffffff60);
  OpenMD::operator-(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_ffffffffffffff60,in_RDI);
  OpenMD::operator*(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Vector3<double>::operator=((Vector3<double> *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60)
  ;
  return;
}

Assistant:

void NPA::getPosScale(const Vector3d& pos, const Vector3d& COM, int index,
                        Vector3d& sc) {
    Vector3d rj = (oldPos[index] + pos) / (RealType)2.0 - COM;
    sc          = eta * rj;
  }